

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O0

void __thiscall lattice::supercell::~supercell(supercell *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(unaff_retaddr);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(unaff_retaddr);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x106838);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x106846);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x106854);
  Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<long,__1,__1,_0,__1,__1> *)0x106862);
  return;
}

Assistant:

supercell() {}